

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,int64_t *value)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  type_conflict tVar6;
  allocator local_3f9;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  allocator local_381;
  string local_380;
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  type_conflict local_300;
  type_conflict result;
  int retcode;
  byte local_2c9;
  string local_2c8 [32];
  string local_2a8 [39];
  allocator local_281;
  string local_280;
  byte local_259;
  string local_258 [38];
  char local_232;
  allocator local_231;
  undefined1 local_230 [6];
  char c;
  string local_210;
  string local_1f0 [32];
  string local_1d0;
  undefined4 local_1b0;
  char local_1ab;
  byte local_1aa;
  byte local_1a9;
  stringstream local_1a8 [5];
  char sc;
  bool negative;
  bool has_sign;
  stringstream ss;
  ostream aoStack_198 [376];
  type_conflict *local_20;
  int64_t *value_local;
  AsciiParser *this_local;
  
  local_20 = value;
  value_local = (int64_t *)this;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  local_1a9 = 0;
  local_1aa = 0;
  bVar1 = Char1(this,&local_1ab);
  if (bVar1) {
    (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
    if (local_1ab == '+') {
      local_1aa = 0;
      local_1a9 = 1;
    }
    else if (local_1ab == '-') {
      local_1aa = 1;
      local_1a9 = 1;
    }
    else if ((local_1ab < '0') || ('9' < local_1ab)) {
      ::std::__cxx11::to_string(&local_210,(int)local_1ab);
      ::std::operator+((char *)local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Sign or 0-9 expected, but got \'");
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d0,(char *)local_1f0);
      PushError(this,&local_1d0);
      ::std::__cxx11::string::~string((string *)&local_1d0);
      ::std::__cxx11::string::~string(local_1f0);
      ::std::__cxx11::string::~string((string *)&local_210);
      this_local._7_1_ = 0;
      goto LAB_00590267;
    }
    ::std::operator<<(aoStack_198,local_1ab);
    if ((local_1aa & 1) == 0) {
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = Char1(this,&local_232);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_00590267;
        }
        if ((local_232 < '0') || ('9' < local_232)) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        ::std::operator<<(aoStack_198,local_232);
      }
      local_259 = 0;
      bVar1 = false;
      if ((local_1a9 & 1) != 0) {
        ::std::__cxx11::stringstream::str();
        local_259 = 1;
        lVar2 = ::std::__cxx11::string::size();
        bVar1 = lVar2 == 1;
      }
      if ((local_259 & 1) != 0) {
        ::std::__cxx11::string::~string(local_258);
      }
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_280,"Integer value expected but got sign character only.\n",
                   &local_281);
        PushError(this,&local_280);
        ::std::__cxx11::string::~string((string *)&local_280);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
        this_local._7_1_ = 0;
      }
      else {
        ::std::__cxx11::stringstream::str();
        uVar3 = ::std::__cxx11::string::size();
        local_2c9 = 0;
        bVar1 = false;
        if (1 < uVar3) {
          ::std::__cxx11::stringstream::str();
          local_2c9 = 1;
          pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)local_2c8);
          bVar1 = *pcVar4 == '0';
        }
        if ((local_2c9 & 1) != 0) {
          ::std::__cxx11::string::~string(local_2c8);
        }
        ::std::__cxx11::string::~string(local_2a8);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&retcode,"Zero padded integer value is not allowed.\n",
                     (allocator *)((long)&result + 7));
          PushError(this,(string *)&retcode);
          ::std::__cxx11::string::~string((string *)&retcode);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
          this_local._7_1_ = 0;
        }
        else {
          ::std::__cxx11::stringstream::str();
          pcVar4 = (char *)::std::__cxx11::string::c_str();
          ::std::__cxx11::stringstream::str();
          lVar2 = ::std::__cxx11::string::c_str();
          ::std::__cxx11::stringstream::str();
          lVar5 = ::std::__cxx11::string::size();
          tVar6 = jsteemann::atoi<long>(pcVar4,(char *)(lVar2 + lVar5),(int *)&result);
          ::std::__cxx11::string::~string(local_360);
          ::std::__cxx11::string::~string(local_340);
          ::std::__cxx11::string::~string(local_320);
          local_300 = tVar6;
          if ((int)result == 0) {
            *local_20 = tVar6;
            this_local._7_1_ = 1;
          }
          else if ((int)result == -1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_380,"Not an 32bit unsigned integer literal.\n",&local_381);
            PushError(this,&local_380);
            ::std::__cxx11::string::~string((string *)&local_380);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
            this_local._7_1_ = 0;
          }
          else if ((int)result == -2) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_3a8,"Negative sign `-` specified for uint32 integer.\n",
                       &local_3a9);
            PushError(this,&local_3a8);
            ::std::__cxx11::string::~string((string *)&local_3a8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
            this_local._7_1_ = 0;
          }
          else if ((int)result == -3) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_3d0,"Integer value overflows.\n",&local_3d1);
            PushError(this,&local_3d0);
            ::std::__cxx11::string::~string((string *)&local_3d0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
            this_local._7_1_ = 0;
          }
          else {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_3f8,"Invalid integer literal\n",&local_3f9);
            PushError(this,&local_3f8);
            ::std::__cxx11::string::~string((string *)&local_3f8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
            this_local._7_1_ = 0;
          }
        }
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)local_230,"Unsigned value expected but got \'-\' sign.",&local_231);
      PushError(this,(string *)local_230);
      ::std::__cxx11::string::~string((string *)local_230);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00590267:
  local_1b0 = 1;
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ReadBasicType(int64_t *value) {
  std::stringstream ss;

  // head character
  bool has_sign = false;
  bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      negative = false;
      has_sign = true;
    } else if (sc == '-') {
      negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  if (negative) {
    PushError("Unsigned value expected but got '-' sign.");
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

  // TODO(syoyo): Use ryu parse.
#if defined(__cpp_exceptions) || defined(__EXCEPTIONS)
  try {
    (*value) = std::stoull(ss.str());
  } catch (const std::invalid_argument &e) {
    (void)e;
    PushError("Not an 64bit unsigned integer literal.\n");
    return false;
  } catch (const std::out_of_range &e) {
    (void)e;
    PushError("64bit unsigned integer value out of range.\n");
    return false;
  }

  return true;
#else
  // use jsteemann/atoi
  int retcode;
  auto result = jsteemann::atoi<int64_t>(
      ss.str().c_str(), ss.str().c_str() + ss.str().size(), retcode);
  if (retcode == jsteemann::SUCCESS) {
    (*value) = result;
    return true;
  } else if (retcode == jsteemann::INVALID_INPUT) {
    PushError("Not an 32bit unsigned integer literal.\n");
    return false;
  } else if (retcode == jsteemann::INVALID_NEGATIVE_SIGN) {
    PushError("Negative sign `-` specified for uint32 integer.\n");
    return false;
  } else if (retcode == jsteemann::VALUE_OVERFLOW) {
    PushError("Integer value overflows.\n");
    return false;
  }

  PushError("Invalid integer literal\n");
  return false;
#endif

  // std::cout << "read int ok\n";
}